

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O3

void __thiscall PcodeBuilder::build(PcodeBuilder *this,ConstructTpl *construct,int4 secnum)

{
  uint4 uVar1;
  OpTpl *pOVar2;
  _func_int **pp_Var3;
  LowlevelError *this_00;
  pointer ppOVar4;
  string local_50;
  
  if (construct != (ConstructTpl *)0x0) {
    uVar1 = this->labelbase;
    this->labelbase = this->labelcount;
    this->labelcount = this->labelcount + construct->numlabels;
    ppOVar4 = (construct->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppOVar4 !=
        (construct->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pOVar2 = *ppOVar4;
        pp_Var3 = this->_vptr_PcodeBuilder;
        switch(pOVar2->opc) {
        case CPUI_MULTIEQUAL:
          (*pp_Var3[3])(this,pOVar2,(ulong)(uint)secnum);
          break;
        case CPUI_INDIRECT:
          (*pp_Var3[4])(this);
          break;
        default:
          (**pp_Var3)(this);
          break;
        case CPUI_PTRADD:
          (*pp_Var3[5])(this);
          break;
        case CPUI_PTRSUB:
          (*pp_Var3[6])(this,pOVar2,(ulong)(uint)secnum);
        }
        ppOVar4 = ppOVar4 + 1;
      } while (ppOVar4 !=
               (construct->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    this->labelbase = uVar1;
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  LowlevelError::LowlevelError(this_00,&local_50);
  *(undefined4 *)&this_00[1].explain._M_dataplus._M_p = 0;
  __cxa_throw(this_00,&UnimplError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void PcodeBuilder::build(ConstructTpl *construct,int4 secnum)

{
  if (construct == (ConstructTpl *)0)
    throw UnimplError("",0);	// Pcode is not implemented for this constructor

  uint4 oldbase = labelbase;	// Recursively store old labelbase
  labelbase = labelcount;	// Set the newbase
  labelcount += construct->numLabels();	// Add labels from this template

  vector<OpTpl *>::const_iterator iter;
  OpTpl *op;
  const vector<OpTpl *> &ops(construct->getOpvec());

  for(iter=ops.begin();iter!=ops.end();++iter) {
    op = *iter;
    switch(op->getOpcode()) {
    case BUILD:
      appendBuild( op, secnum );
      break;
    case DELAY_SLOT:
      delaySlot( op );
      break;
    case LABELBUILD:
      setLabel( op );
      break;
    case CROSSBUILD:
      appendCrossBuild(op,secnum);
      break;
    default:
      dump( op );
      break;
    }
  }
  labelbase = oldbase;		// Restore old labelbase
}